

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

bool __thiscall runtime::VirtualMachine::booleanValueOfVariable(VirtualMachine *this,Variable var)

{
  allocator<char> local_49;
  string local_48;
  VirtualMachine *local_28;
  VirtualMachine *this_local;
  Variable var_local;
  
  var_local._0_8_ = var.field_1;
  this_local._0_4_ = var.type;
  switch((VariableType)this_local) {
  case Undefined:
    var_local.field_1.integerValue._7_1_ = 0;
    break;
  case Integer:
  case Float:
  case String:
  case Object:
  case Function:
    var_local.field_1.integerValue._7_1_ = 1;
    break;
  case Boolean:
    var_local.type._0_1_ = var.field_1._0_1_;
    var_local.field_1.integerValue._7_1_ = (undefined1)var_local.type & Integer;
    break;
  default:
    local_28 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Unknown varible type at booleanValueOfVariable",&local_49);
    panic(this,&local_48);
  }
  return var_local.field_1._7_1_;
}

Assistant:

bool runtime::VirtualMachine::booleanValueOfVariable(Variable var) {
  switch (var.type) {
    case VariableType::Integer:
    case VariableType::Float:
    case VariableType::Function:
    case VariableType::Object:
    case VariableType::String: {
      return true;
    }
    case VariableType::Undefined: {
      return false;
    }
    case VariableType::Boolean: {
      return var.boolValue;
    }
    default: {
      this->panic("Unknown varible type at booleanValueOfVariable");
    }
  }
}